

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,false,false,true,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  ulong uVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  idx_t iVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  sel_t sVar17;
  ulong uVar18;
  
  if (count + 0x3f < 0x40) {
    iVar9 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar9 = 0;
    lVar12 = 0;
    uVar11 = 0;
    uVar15 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar16 = 0xffffffffffffffff;
      }
      else {
        uVar16 = puVar1[uVar11];
      }
      uVar14 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar14 = count;
      }
      uVar13 = uVar15;
      if (uVar16 == 0xffffffffffffffff) {
        if (uVar15 < uVar14) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          uVar18 = uVar15 << 4 | 8;
          do {
            uVar13 = uVar15;
            if (psVar2 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar2[uVar15];
            }
            uVar4 = *(ulong *)((long)ldata + (uVar18 - 8));
            lVar7 = *(long *)((long)&ldata->lower + uVar18);
            lVar8 = *(long *)((long)&rdata->lower + uVar18);
            bVar10 = lVar7 == lVar8;
            uVar5 = *(ulong *)((long)rdata + (uVar18 - 8));
            psVar3[iVar9] = (sel_t)uVar13;
            iVar9 = iVar9 + (uVar5 < uVar4 && bVar10 || !bVar10 && lVar8 <= lVar7);
            psVar6[lVar12] = (sel_t)uVar13;
            lVar12 = lVar12 + (ulong)((uVar4 <= uVar5 || !bVar10) && (bVar10 || lVar8 > lVar7));
            uVar15 = uVar15 + 1;
            uVar18 = uVar18 + 0x10;
            uVar13 = uVar15;
          } while (uVar14 != uVar15);
        }
      }
      else if (uVar16 == 0) {
        uVar13 = uVar14;
        if (uVar15 < uVar14) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar17 = (sel_t)uVar15;
            if (psVar2 != (sel_t *)0x0) {
              sVar17 = psVar2[uVar15];
            }
            psVar3[lVar12] = sVar17;
            lVar12 = lVar12 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
      }
      else if (uVar15 < uVar14) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        uVar18 = uVar15 << 4 | 8;
        uVar13 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar17 = (int)uVar15 + (int)uVar13;
          }
          else {
            sVar17 = psVar2[uVar15 + uVar13];
          }
          if ((uVar16 >> (uVar13 & 0x3f) & 1) == 0) {
            bVar10 = false;
          }
          else {
            lVar7 = *(long *)((long)&ldata->lower + uVar18);
            lVar8 = *(long *)((long)&rdata->lower + uVar18);
            bVar10 = *(ulong *)((long)rdata + (uVar18 - 8)) < *(ulong *)((long)ldata + (uVar18 - 8))
                     && lVar7 == lVar8 || lVar7 != lVar8 && lVar8 <= lVar7;
          }
          psVar3[iVar9] = sVar17;
          iVar9 = iVar9 + bVar10;
          psVar6[lVar12] = sVar17;
          lVar12 = lVar12 + (ulong)(bVar10 ^ 1);
          uVar13 = uVar13 + 1;
          uVar18 = uVar18 + 0x10;
        } while ((uVar15 - uVar14) + uVar13 != 0);
        uVar13 = uVar15 + uVar13;
      }
      uVar11 = uVar11 + 1;
      uVar15 = uVar13;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return iVar9;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}